

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxc.cxx
# Opt level: O0

XCKernel ExchCXX::libxc_kernel_factory(string *xc_name,Spin spin_polar)

{
  bool bVar1;
  byte bVar2;
  undefined8 uVar3;
  string *in_RSI;
  string *in_RDI;
  impl_ptr *in_stack_fffffffffffffef8;
  unique_ptr<ExchCXX::detail::LibxcKernelImpl,_std::default_delete<ExchCXX::detail::LibxcKernelImpl>_>
  *this;
  unique_ptr<ExchCXX::detail::XCKernelImpl,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
  *in_stack_ffffffffffffff10;
  undefined7 in_stack_ffffffffffffff28;
  _Head_base<0UL,_ExchCXX::detail::XCKernelImpl_*,_false> this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args;
  unique_ptr<ExchCXX::detail::LibxcKernelImpl,_std::default_delete<ExchCXX::detail::LibxcKernelImpl>_>
  local_a8;
  unique_ptr<ExchCXX::detail::LibxcKernelImpl,_std::default_delete<ExchCXX::detail::LibxcKernelImpl>_>
  local_a0;
  undefined1 local_92;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  __args = &local_38;
  this_00._M_head_impl = (XCKernelImpl *)in_RDI;
  std::__cxx11::string::string((string *)__args,in_RSI);
  bVar1 = libxc_supports_functional((string *)0x25b29c);
  bVar2 = bVar1 ^ 0xff;
  std::__cxx11::string::~string((string *)&local_38);
  if ((bVar2 & 1) == 0) {
    this = &local_a8;
    std::
    make_unique<ExchCXX::detail::LibxcKernelImpl,std::__cxx11::string_const&,ExchCXX::Spin_const&>
              (__args,(Spin *)this_00._M_head_impl);
    std::
    unique_ptr<ExchCXX::detail::XCKernelImpl,std::default_delete<ExchCXX::detail::XCKernelImpl>>::
    unique_ptr<ExchCXX::detail::LibxcKernelImpl,std::default_delete<ExchCXX::detail::LibxcKernelImpl>,void>
              (in_stack_ffffffffffffff10,&local_a0);
    XCKernel::XCKernel((XCKernel *)this,in_stack_fffffffffffffef8);
    std::
    unique_ptr<ExchCXX::detail::XCKernelImpl,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>::
    ~unique_ptr((unique_ptr<ExchCXX::detail::XCKernelImpl,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                 *)this);
    std::
    unique_ptr<ExchCXX::detail::LibxcKernelImpl,_std::default_delete<ExchCXX::detail::LibxcKernelImpl>_>
    ::~unique_ptr(this);
    return (impl_ptr)(impl_ptr)this_00._M_head_impl;
  }
  local_92 = 1;
  uVar3 = __cxa_allocate_exception(0x50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             this_00._M_head_impl,(char *)in_RDI,(allocator<char> *)in_RSI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             this_00._M_head_impl,(char *)in_RDI,(allocator<char> *)in_RSI);
  exchcxx_exception::exchcxx_exception
            ((exchcxx_exception *)this_00._M_head_impl,in_RDI,(int)((ulong)in_RSI >> 0x20),
             (string *)CONCAT17(bVar2,in_stack_ffffffffffffff28));
  local_92 = 0;
  __cxa_throw(uVar3,&exchcxx_exception::typeinfo,exchcxx_exception::~exchcxx_exception);
}

Assistant:

XCKernel libxc_kernel_factory( const std::string xc_name,
  const Spin spin_polar ) {

  EXCHCXX_BOOL_CHECK( "LibXC FUNCTIONAL NOT FOUND", libxc_supports_functional(xc_name) )

  return XCKernel(
      std::make_unique< detail::LibxcKernelImpl >( xc_name, spin_polar ) );

}